

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexOptimize(Fts5Index *p)

{
  bool bVar1;
  int iVar2;
  int local_28;
  int local_24;
  int nRem;
  int iLvl;
  Fts5Structure *pNew;
  Fts5Structure *pStruct;
  Fts5Index *p_local;
  
  _nRem = (Fts5Structure *)0x0;
  pStruct = (Fts5Structure *)p;
  fts5IndexFlush(p);
  pNew = fts5StructureRead((Fts5Index *)pStruct);
  fts5StructureInvalidate((Fts5Index *)pStruct);
  if (pNew != (Fts5Structure *)0x0) {
    _nRem = fts5IndexOptimizeStruct((Fts5Index *)pStruct,pNew);
  }
  fts5StructureRelease(pNew);
  if (_nRem != (Fts5Structure *)0x0) {
    local_24 = 0;
    while (_nRem->aLevel[local_24].nSeg == 0) {
      local_24 = local_24 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (*(int *)((long)&pStruct[1].nWriteCounter + 4) == 0) {
        bVar1 = 0 < _nRem->aLevel[local_24].nSeg;
      }
      if (!bVar1) break;
      local_28 = 1000;
      fts5IndexMergeLevel((Fts5Index *)pStruct,(Fts5Structure **)&nRem,local_24,&local_28);
    }
    fts5StructureWrite((Fts5Index *)pStruct,_nRem);
    fts5StructureRelease(_nRem);
  }
  iVar2 = fts5IndexReturn((Fts5Index *)pStruct);
  return iVar2;
}

Assistant:

static int sqlite3Fts5IndexOptimize(Fts5Index *p){
  Fts5Structure *pStruct;
  Fts5Structure *pNew = 0;

  assert( p->rc==SQLITE_OK );
  fts5IndexFlush(p);
  pStruct = fts5StructureRead(p);
  fts5StructureInvalidate(p);

  if( pStruct ){
    pNew = fts5IndexOptimizeStruct(p, pStruct);
  }
  fts5StructureRelease(pStruct);

  assert( pNew==0 || pNew->nSegment>0 );
  if( pNew ){
    int iLvl;
    for(iLvl=0; pNew->aLevel[iLvl].nSeg==0; iLvl++){}
    while( p->rc==SQLITE_OK && pNew->aLevel[iLvl].nSeg>0 ){
      int nRem = FTS5_OPT_WORK_UNIT;
      fts5IndexMergeLevel(p, &pNew, iLvl, &nRem);
    }

    fts5StructureWrite(p, pNew);
    fts5StructureRelease(pNew);
  }

  return fts5IndexReturn(p); 
}